

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O1

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs;
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  pointer pcVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer pcVar13;
  ulong uVar14;
  bool bVar15;
  MessageType messageType;
  string err;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileContext execContext;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_19c;
  undefined1 local_198 [32];
  cmMakefile *local_178;
  cmMakefile *local_170;
  string local_168;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_148;
  cmExecutionStatus *local_128;
  cmCommandContext local_120;
  long *local_f8 [2];
  long local_e8 [2];
  _Base_ptr *local_d8 [2];
  _Base_ptr local_c8 [2];
  long local_b8;
  undefined1 local_b0 [40];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  cmListFileBacktrace local_60;
  
  iVar9 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"while");
  if (iVar9 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar9 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar9 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_b0,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar15 = (cmMakefile *)local_b0._0_8_ != (cmMakefile *)0x0;
        if (bVar15) {
          local_178 = (cmMakefile *)local_b0._0_8_;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          local_168._M_string_length = 0;
          local_168.field_2._M_local_buf[0] = '\0';
          local_148.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          inArgs = &this->Args;
          cmMakefile::ExpandArguments(mf,inArgs,&local_148,(char *)0x0);
          local_f8[0] = local_e8;
          pcVar1 = (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar1,
                     pcVar1 + (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length)
          ;
          local_d8[0] = local_c8;
          pcVar1 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,pcVar1,
                     pcVar1 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                              _M_string_length);
          local_120.Line = (this->super_cmFunctionBlocker).StartingContext.Line;
          local_120.Name._M_dataplus._M_p = (pointer)&local_120.Name.field_2;
          local_120.Name._M_string_length = 0;
          local_120.Name.field_2._M_local_buf[0] = '\0';
          local_b8 = local_120.Line;
          std::__cxx11::string::_M_assign((string *)&local_120);
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,mf,&local_120);
          cmConditionEvaluator::cmConditionEvaluator
                    ((cmConditionEvaluator *)local_b0,mf,
                     &(this->super_cmFunctionBlocker).StartingContext,
                     (cmListFileBacktrace *)local_198);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_198);
          bVar6 = cmConditionEvaluator::IsTrue
                            ((cmConditionEvaluator *)local_b0,&local_148,&local_168,&local_19c);
          local_170 = mf;
          local_128 = inStatus;
          while (bVar6 != false) {
            if (local_168._M_string_length != 0) {
              local_198._0_8_ = local_198 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_198,"had incorrect arguments: ","");
              if ((this->Args).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (this->Args).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                uVar11 = 0;
                uVar14 = 1;
                do {
                  std::__cxx11::string::append((char *)local_198);
                  std::__cxx11::string::_M_append
                            ((char *)local_198,
                             (ulong)(inArgs->
                                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar11].Value.
                                    _M_dataplus._M_p);
                  std::__cxx11::string::append((char *)local_198);
                  std::__cxx11::string::append((char *)local_198);
                  uVar11 = ((long)(this->Args).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->Args).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                           -0x5555555555555555;
                  bVar6 = uVar14 <= uVar11;
                  lVar3 = uVar11 - uVar14;
                  uVar11 = uVar14;
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (bVar6 && lVar3 != 0);
              }
              std::__cxx11::string::append((char *)local_198);
              mf = local_170;
              std::__cxx11::string::_M_append((char *)local_198,(ulong)local_168._M_dataplus._M_p);
              std::__cxx11::string::append((char *)local_198);
              cmMakefile::IssueMessage(mf,local_19c,(string *)local_198);
              if (local_19c == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccured = true;
                if ((cmState *)local_198._0_8_ != (cmState *)(local_198 + 0x10)) {
                  operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                }
                break;
              }
              if ((cmState *)local_198._0_8_ != (cmState *)(local_198 + 0x10)) {
                operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
              }
            }
            pcVar10 = (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((this->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish != pcVar10) {
              uVar11 = 0;
              uVar14 = 1;
              do {
                local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
                cmMakefile::ExecuteCommand(mf,pcVar10 + uVar11,(cmExecutionStatus *)local_198);
                if (local_198[0] == '\x01') {
                  inStatus->ReturnInvoked = true;
LAB_0034ccba:
                  cVar7 = '\x01';
LAB_0034ccbf:
                  bVar8 = 0;
                }
                else {
                  if (local_198[1] != '\0') goto LAB_0034ccba;
                  if (local_198[2] != '\0') {
                    cVar7 = '\a';
                    goto LAB_0034ccbf;
                  }
                  cVar7 = true;
                  if (cmSystemTools::s_FatalErrorOccured == false) {
                    cVar7 = cmSystemTools::GetInterruptFlag();
                  }
                  bVar8 = cVar7 ^ 1;
                }
                if (bVar8 == 0) goto LAB_0034cd0e;
                pcVar10 = (this->Functions).
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar6 = uVar14 < (ulong)((long)(this->Functions).
                                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pcVar10 >> 6);
                uVar11 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar6);
              cVar7 = '\a';
LAB_0034cd0e:
              if (cVar7 != '\a') break;
            }
            pcVar5 = local_148.
                     super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar4 = local_148.
                     super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_148.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_148.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar12 = &((local_148.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Value).field_2;
              do {
                plVar2 = (long *)(((string *)(paVar12 + -1))->_M_dataplus)._M_p;
                if (paVar12 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar12->_M_allocated_capacity + 1);
                }
                pcVar13 = (pointer)((long)paVar12 + 0x18);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar12 + 0x28);
              } while (pcVar13 != pcVar5);
              local_148.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_finish = pcVar4;
              inStatus = local_128;
            }
            mf = local_170;
            cmMakefile::ExpandArguments(local_170,inArgs,&local_148,(char *)0x0);
            bVar6 = cmConditionEvaluator::IsTrue
                              ((cmConditionEvaluator *)local_b0,&local_148,&local_168,&local_19c);
          }
          cmListFileBacktrace::~cmListFileBacktrace(&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_p != &local_78) {
            operator_delete(local_88._M_p,(ulong)(local_78._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
            operator_delete((void *)local_b0._8_8_,(ulong)(local_b0._24_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120.Name._M_dataplus._M_p != &local_120.Name.field_2) {
            operator_delete(local_120.Name._M_dataplus._M_p,
                            CONCAT71(local_120.Name.field_2._M_allocated_capacity._1_7_,
                                     local_120.Name.field_2._M_local_buf[0]) + 1);
          }
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],(ulong)((long)&local_c8[0]->_M_color + 1));
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0],local_e8[0] + 1);
          }
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector(&local_148);
          local_b0._0_8_ = local_178;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                     local_168.field_2._M_local_buf[0]) + 1);
            local_b0._0_8_ = local_178;
          }
        }
        if ((cmMakefile *)local_b0._0_8_ == (cmMakefile *)0x0) {
          return bVar15;
        }
        (**(code **)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (((cmMakefile *)local_b0._0_8_)->FindPackageModuleStack).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map)->field_2 + 8))();
        return bVar15;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "while")) {
    // record the number of while commands past this one
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endwhile")) {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for (i = 0; i < this->Args.size(); ++i) {
            err += (this->Args[i].Delim ? "\"" : "");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (unsigned int c = 0; c < this->Functions.size(); ++c) {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}